

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

void __thiscall test_rope::initialize_tensors(test_rope *this,ggml_context *ctx)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *this_00;
  allocator_type *__a;
  reference pvVar4;
  int *piVar5;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  vector<int,_std::allocator<int>_> data;
  int num_pos_ids;
  ggml_tensor *t;
  float in_stack_000001f8;
  float in_stack_000001fc;
  ggml_tensor *in_stack_00000200;
  size_type in_stack_ffffffffffffff78;
  array<long,_4UL> *in_stack_ffffffffffffff80;
  undefined1 *__n;
  int local_50;
  undefined1 local_39;
  vector<int,_std::allocator<int>_> local_38;
  int local_1c;
  array<long,_4UL> *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  for (local_18 = (array<long,_4UL> *)ggml_get_first_tensor(in_RSI);
      local_18 != (array<long,_4UL> *)0x0;
      local_18 = (array<long,_4UL> *)ggml_get_next_tensor(local_10,local_18)) {
    if ((int)local_18->_M_elems[0] == 0x1a) {
      if ((*(uint *)(in_RDI + 100) & 8) == 0) {
        pvVar3 = std::array<long,_4UL>::operator[]
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        this_00 = (vector<int,_std::allocator<int>_> *)*pvVar3;
      }
      else {
        pvVar3 = std::array<long,_4UL>::operator[]
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        this_00 = (vector<int,_std::allocator<int>_> *)(*pvVar3 << 2);
      }
      local_1c = (int)this_00;
      __a = (allocator_type *)(long)local_1c;
      __n = &local_39;
      std::allocator<int>::allocator((allocator<int> *)0x15f358);
      std::vector<int,_std::allocator<int>_>::vector(this_00,(size_type)__n,__a);
      std::allocator<int>::~allocator((allocator<int> *)0x15f378);
      for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
        iVar2 = rand();
        iVar1 = *(int *)(in_RDI + 0x68);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_50);
        *pvVar4 = iVar2 % iVar1;
      }
      in_stack_ffffffffffffff80 = local_18;
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x15f3ef);
      ggml_backend_tensor_set(in_stack_ffffffffffffff80,piVar5,0,(long)local_1c << 2);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
    }
    else {
      in_stack_ffffffffffffff78 = local_18->_M_elems[2];
      if (in_stack_ffffffffffffff78 == (long)(*(int *)(in_RDI + 0x60) / 2)) {
        init_tensor_uniform(in_stack_00000200,in_stack_000001fc,in_stack_000001f8);
      }
      else {
        init_tensor_uniform(in_stack_00000200,in_stack_000001fc,in_stack_000001f8);
      }
    }
  }
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                // pos
                const int num_pos_ids = (mode & GGML_ROPE_TYPE_MROPE) ? ne_a[2] * 4 : ne_a[2];
                std::vector<int> data(num_pos_ids);
                for (int i = 0; i < num_pos_ids; i++) {
                    data[i] = rand() % n_ctx;
                }
                ggml_backend_tensor_set(t, data.data(), 0, num_pos_ids * sizeof(int));
            } else {
                if (t->ne[0] == n_dims/2) {
                    // frequency factors in the range [0.9f, 1.1f]
                    init_tensor_uniform(t, 0.9f, 1.1f);
                } else {
                    init_tensor_uniform(t);
                }
            }
        }
    }